

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::GetLabel(TypeChecker *this,Index depth,Label **out_label)

{
  pointer pLVar1;
  pointer pLVar2;
  Enum EVar3;
  ulong uVar4;
  long lVar5;
  Label *pLVar6;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::TypeChecker::Label,_std::allocator<wabt::TypeChecker::Label>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pLVar2 - (long)pLVar1;
  uVar4 = lVar5 / 0x48;
  if (depth < uVar4) {
    pLVar6 = (Label *)((long)pLVar1 + ~(ulong)depth * 0x48 + lVar5);
    EVar3 = Ok;
  }
  else {
    if (pLVar2 == pLVar1) {
      __assert_fail("label_stack_.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/type-checker.cc"
                    ,0x3f,"Result wabt::TypeChecker::GetLabel(Index, Label **)");
    }
    pLVar6 = (Label *)0x0;
    PrintError(this,"invalid depth: %u (max %zd)",depth,uVar4 - 1);
    EVar3 = Error;
  }
  *out_label = pLVar6;
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::GetLabel(Index depth, Label** out_label) {
  if (depth >= label_stack_.size()) {
    assert(label_stack_.size() > 0);
    PrintError("invalid depth: %" PRIindex " (max %" PRIzd ")", depth,
               label_stack_.size() - 1);
    *out_label = nullptr;
    return Result::Error;
  }
  *out_label = &label_stack_[label_stack_.size() - depth - 1];
  return Result::Ok;
}